

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,Type *type,bool can_override)

{
  BaseType BVar1;
  undefined7 in_register_00000009;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((int)CONCAT71(in_register_00000009,can_override) == 0) {
    BVar1 = type->base_type;
  }
  else {
    if (type->enum_def != (EnumDef *)0x0) {
      IdlNamer::NamespacedType_abi_cxx11_
                (__return_storage_ptr__,&this->namer_,&type->enum_def->super_Definition);
      return __return_storage_ptr__;
    }
    BVar1 = type->base_type;
    if (BVar1 == BASE_TYPE_BOOL) {
      __s = "Bool";
      __a = &local_9;
      goto LAB_002156cb;
    }
  }
  __s = GenTypeBasic::swift_type[(int)BVar1];
  __a = &local_a;
LAB_002156cb:
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const Type &type, bool can_override) const {
    // clang-format off
    static const char * const swift_type[] = {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, \
              CTYPE, JTYPE, GTYPE, NTYPE, PTYPE, RTYPE, KTYPE, STYPE, ...) \
        #STYPE,
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    };
    // clang-format on
    if (can_override) {
      if (type.enum_def) return namer_.NamespacedType(*type.enum_def);
      if (type.base_type == BASE_TYPE_BOOL) return "Bool";
    }
    return swift_type[static_cast<int>(type.base_type)];
  }